

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable_binary.hpp
# Opt level: O0

void __thiscall
cereal::PortableBinaryInputArchive::PortableBinaryInputArchive
          (PortableBinaryInputArchive *this,istream *stream,Options *options)

{
  byte bVar1;
  Options *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  uint8_t streamLittleEndian;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined **this_00;
  PortableBinaryInputArchive *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  byte in_stack_ffffffffffffffe7;
  
  this_00 = &PTR__PortableBinaryInputArchive_005d64b0;
  *in_RDI = &PTR__PortableBinaryInputArchive_005d64b0;
  InputArchive<cereal::PortableBinaryInputArchive,_1U>::InputArchive
            ((InputArchive<cereal::PortableBinaryInputArchive,_1U> *)
             CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
            );
  *in_RDI = this_00;
  in_RDI[0x1e] = in_RSI;
  *(undefined1 *)(in_RDI + 0x1f) = 0;
  InputArchive<cereal::PortableBinaryInputArchive,1u>::operator()
            ((InputArchive<cereal::PortableBinaryInputArchive,_1U> *)this_00,
             (uchar *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  bVar1 = Options::is_little_endian(in_RDX);
  *(byte *)(in_RDI + 0x1f) = bVar1 ^ in_stack_ffffffffffffffe7;
  return;
}

Assistant:

PortableBinaryInputArchive(std::istream & stream, Options const & options = Options::Default()) :
        InputArchive<PortableBinaryInputArchive, AllowEmptyClassElision>(this),
        itsStream(stream),
        itsConvertEndianness( false )
      {
        uint8_t streamLittleEndian;
        this->operator()( streamLittleEndian );
        itsConvertEndianness = options.is_little_endian() ^ streamLittleEndian;
      }